

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltl_parser.c
# Opt level: O1

void Abc_FrameCopyLTLDataBase(Abc_Frame_t *pAbc,Abc_Ntk_t *pNtk)

{
  uint uVar1;
  char *__s;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  size_t sVar4;
  char *__dest;
  int iVar5;
  int iVar6;
  long lVar7;
  
  pVVar2 = pAbc->vLTLProperties_global;
  if (pVVar2 != (Vec_Ptr_t *)0x0) {
    if (pVVar2->pArray != (void **)0x0) {
      free(pVVar2->pArray);
      pVVar2->pArray = (void **)0x0;
    }
    free(pVVar2);
    pAbc->vLTLProperties_global = (Vec_Ptr_t *)0x0;
  }
  iVar6 = pNtk->vLtlProperties->nSize;
  pVVar2 = (Vec_Ptr_t *)malloc(0x10);
  iVar5 = 8;
  if (6 < iVar6 - 1U) {
    iVar5 = iVar6;
  }
  pVVar2->nSize = 0;
  pVVar2->nCap = iVar5;
  if (iVar5 == 0) {
    ppvVar3 = (void **)0x0;
  }
  else {
    ppvVar3 = (void **)malloc((long)iVar5 << 3);
  }
  pVVar2->pArray = ppvVar3;
  pAbc->vLTLProperties_global = pVVar2;
  pVVar2 = pNtk->vLtlProperties;
  if (0 < pVVar2->nSize) {
    lVar7 = 0;
    do {
      __s = (char *)pVVar2->pArray[lVar7];
      sVar4 = strlen(__s);
      __dest = (char *)malloc(sVar4 + 1);
      strcpy(__dest,__s);
      pVVar2 = pAbc->vLTLProperties_global;
      uVar1 = pVVar2->nCap;
      if (pVVar2->nSize == uVar1) {
        if ((int)uVar1 < 0x10) {
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc(0x80);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar2->pArray,0x80);
          }
          pVVar2->pArray = ppvVar3;
          iVar6 = 0x10;
        }
        else {
          iVar6 = uVar1 * 2;
          if (iVar6 <= (int)uVar1) goto LAB_0062e3c9;
          if (pVVar2->pArray == (void **)0x0) {
            ppvVar3 = (void **)malloc((ulong)uVar1 << 4);
          }
          else {
            ppvVar3 = (void **)realloc(pVVar2->pArray,(ulong)uVar1 << 4);
          }
          pVVar2->pArray = ppvVar3;
        }
        pVVar2->nCap = iVar6;
      }
LAB_0062e3c9:
      iVar6 = pVVar2->nSize;
      pVVar2->nSize = iVar6 + 1;
      pVVar2->pArray[iVar6] = __dest;
      lVar7 = lVar7 + 1;
      pVVar2 = pNtk->vLtlProperties;
    } while (lVar7 < pVVar2->nSize);
  }
  return;
}

Assistant:

void Abc_FrameCopyLTLDataBase( Abc_Frame_t *pAbc, Abc_Ntk_t * pNtk )
{
    char *pLtlFormula, *tempFormula;
    int i;

    if( pAbc->vLTLProperties_global != NULL )
    {
//        printf("Deleting exisitng LTL database from the frame\n");
        Vec_PtrFree( pAbc->vLTLProperties_global );
        pAbc->vLTLProperties_global = NULL;
    }
    pAbc->vLTLProperties_global = Vec_PtrAlloc(Vec_PtrSize(pNtk->vLtlProperties));
    Vec_PtrForEachEntry( char *, pNtk->vLtlProperties, pLtlFormula, i )
    {
        tempFormula = (char *)malloc( sizeof(char)*(strlen(pLtlFormula)+1) );
        sprintf( tempFormula, "%s", pLtlFormula );
        Vec_PtrPush( pAbc->vLTLProperties_global, tempFormula );
    }
}